

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkSparsifyInternal(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  DdManager *dd;
  Abc_Obj_t *pObj;
  uint uVar1;
  Abc_Ntk_t *pNtkNew;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  DdNode *n;
  Abc_Obj_t *pAVar4;
  int nFanins;
  char *pSuffix;
  long lVar5;
  long lVar6;
  DdNode *bFunc;
  Abc_Obj_t *pAVar7;
  ulong uVar8;
  bool bVar9;
  
  pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar3->pArray[lVar5],1);
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew->pName = pcVar2;
  pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew->pSpec = pcVar2;
  dd = (DdManager *)pNtkNew->pManFunc;
  Cudd_bddIthVar(dd,pNtk->vCis->nSize + -1);
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar5];
      pAVar7 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      uVar1 = *(uint *)&pAVar7->field_0x14 & 0xf;
      if ((uVar1 == 5) || (uVar1 == 2)) {
        Abc_NtkDupObj(pNtkNew,pObj,0);
        Abc_ObjAddFanin((pObj->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
                        (ulong)(pAVar7->field_6).pTemp));
        pAVar4 = (pObj->field_6).pCopy;
        pcVar2 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pAVar4,pcVar2,"_on");
        Abc_NtkDupObj(pNtkNew,pObj,0);
        pAVar4 = (pObj->field_6).pCopy;
        pAVar7 = (Abc_Obj_t *)
                 ((ulong)((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) ^
                 (ulong)(pAVar7->field_6).pTemp);
LAB_002b8f76:
        Abc_ObjAddFanin(pAVar4,pAVar7);
        pAVar7 = (pObj->field_6).pCopy;
        pcVar2 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pAVar7,pcVar2,"_off");
      }
      else {
        if ((pAVar7->vFanins).nSize == 0) {
          Abc_NtkDupObj(pNtkNew,pObj,0);
          pAVar7 = (pObj->field_6).pCopy;
          if ((pObj->field_0x15 & 4) == 0) {
            pAVar4 = Abc_NtkCreateNodeConst1(pNtkNew);
          }
          else {
            pAVar4 = Abc_NtkCreateNodeConst0(pNtkNew);
          }
          Abc_ObjAddFanin(pAVar7,pAVar4);
          pAVar7 = (pObj->field_6).pCopy;
          pcVar2 = Abc_ObjName(pObj);
          Abc_ObjAssignName(pAVar7,pcVar2,"_on");
          Abc_NtkDupObj(pNtkNew,pObj,0);
          pAVar4 = (pObj->field_6).pCopy;
          if ((pObj->field_0x15 & 4) == 0) {
            pAVar7 = Abc_NtkCreateNodeConst0(pNtkNew);
          }
          else {
            pAVar7 = Abc_NtkCreateNodeConst1(pNtkNew);
          }
          goto LAB_002b8f76;
        }
        if ((pObj->vFanins).nSize < 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDsd.c"
                        ,0x293,"Abc_Ntk_t *Abc_NtkSparsifyInternal(Abc_Ntk_t *, int, int)");
        }
        uVar8 = 0;
        do {
          Cudd_Srandom(0);
          Abc_NtkDupObj(pNtkNew,pAVar7,0);
          nFanins = (pAVar7->vFanins).nSize;
          if (0 < nFanins) {
            lVar6 = 0;
            do {
              Abc_ObjAddFanin((pAVar7->field_6).pCopy,
                              *(Abc_Obj_t **)
                               ((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar6]] +
                               0x40));
              lVar6 = lVar6 + 1;
              nFanins = (pAVar7->vFanins).nSize;
            } while (lVar6 < nFanins);
          }
          bFunc = (DdNode *)((ulong)(((pAVar7->field_6).pCopy)->field_5).pData ^ uVar8);
          n = Abc_NtkSparsifyInternalOne(dd,bFunc,nFanins,nPerc);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,bFunc);
          (((pAVar7->field_6).pCopy)->field_5).pData = n;
          Abc_NtkDupObj(pNtkNew,pObj,0);
          Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar7->field_6).pCopy);
          pAVar4 = (pObj->field_6).pCopy;
          pcVar2 = Abc_ObjName(pObj);
          pSuffix = "_off";
          if (uVar8 == 0) {
            pSuffix = "_on";
          }
          Abc_ObjAssignName(pAVar4,pcVar2,pSuffix);
          bVar9 = uVar8 == 0;
          uVar8 = uVar8 + 1;
        } while (bVar9);
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  Abc_NtkLogicMakeSimpleCos(pNtkNew,0);
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsifyInternal( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pDriver, * pFanin;
    DdNode * bFunc, * bFuncOld;
    DdManager * ddNew;
    int i, k, c;
    // start the new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // make sure the new manager has enough inputs
    ddNew = (DdManager *)pNtkNew->pManFunc;
    Cudd_bddIthVar( ddNew, Abc_NtkCiNum(pNtk)-1 );
    // go through the outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0( pObj );
        if ( Abc_ObjIsCi(pDriver) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, !Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        if ( Abc_ObjFaninNum(pDriver) == 0 )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        assert( Abc_ObjFaninNum(pObj) > 0 );
        // onset/offset
        for ( c = 0; c < 2; c++ )
        {
            Cudd_Srandom( 0 );
            Abc_NtkDupObj( pNtkNew, pDriver, 0 );
            Abc_ObjForEachFanin( pDriver, pFanin, k )
                Abc_ObjAddFanin( pDriver->pCopy, pFanin->pCopy );
            bFuncOld = Cudd_NotCond( (DdNode *)pDriver->pCopy->pData, c );
            bFunc = Abc_NtkSparsifyInternalOne( ddNew, bFuncOld, Abc_ObjFaninNum(pDriver), nPerc );  Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( ddNew, bFuncOld );
            pDriver->pCopy->pData = bFunc;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), (char*)(c ? "_off" : "_on") );
        }
    }
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    return pNtkNew;
}